

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::cbor::
basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
::handle_string(basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
                *this,item_event_visitor *visitor,
               basic_string_view<char,_std::char_traits<char>_> *v,error_code *ec)

{
  ulong uVar1;
  uint64_t uVar2;
  byte bVar3;
  
  uVar1 = (this->other_tags_).super__Base_bitset<1UL>._M_w;
  if ((uVar1 & 4) == 0) {
    bVar3 = 0;
  }
  else {
    uVar2 = this->raw_tag_;
    bVar3 = 0;
    if ((long)uVar2 < 0x21) {
      if (uVar2 == 0) {
        bVar3 = 4;
      }
      else {
        bVar3 = 0;
        if (uVar2 == 0x20) {
          bVar3 = 0xe;
        }
      }
    }
    else if (uVar2 == 0x21) {
      bVar3 = 0xc;
    }
    else if (uVar2 == 0x22) {
      bVar3 = 9;
    }
    (this->other_tags_).super__Base_bitset<1UL>._M_w = uVar1 & 0xfffffffffffffffb;
  }
  (*visitor->_vptr_basic_item_event_visitor[0xb])(visitor,v,(ulong)bVar3,this,ec);
  this->more_ = (bool)(this->cursor_mode_ ^ 1);
  return;
}

Assistant:

void handle_string(item_event_visitor& visitor, const jsoncons::basic_string_view<char>& v, std::error_code& ec)
    {
        semantic_tag tag = semantic_tag::none;
        if (other_tags_[item_tag])
        {
            switch (raw_tag_)
            {
                case 0:
                    tag = semantic_tag::datetime;
                    break;
                case 32:
                    tag = semantic_tag::uri;
                    break;
                case 33:
                    tag = semantic_tag::base64url;
                    break;
                case 34:
                    tag = semantic_tag::base64;
                    break;
                default:
                    break;
            }
            other_tags_[item_tag] = false;
        }
        visitor.string_value(v, tag, *this, ec);
        more_ = !cursor_mode_;
    }